

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

istream * maths::operator>>(istream *is,Matrix *m)

{
  long lVar1;
  long lVar2;
  
  if (0 < m->rows_) {
    lVar2 = 0;
    do {
      if (0 < m->cols_) {
        lVar1 = 0;
        do {
          std::istream::_M_extract<double>((double *)is);
          lVar1 = lVar1 + 1;
        } while (lVar1 < m->cols_);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < m->rows_);
  }
  return is;
}

Assistant:

istream& operator>>(istream& is, Matrix& m)
{
    for (int i = 0; i < m.rows_; ++i) {
        for (int j = 0; j < m.cols_; ++j) {
            is >> m.p[i][j];
        }
    }
    return is;
}